

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceReleaseQueue.hpp
# Opt level: O1

DynamicStaleResourceWrapper __thiscall
Diligent::DynamicStaleResourceWrapper::Create<VulkanUtilities::VulkanMemoryAllocation,void>
          (DynamicStaleResourceWrapper *this,VulkanMemoryAllocation *Resource,
          RefCounterType NumReferences)

{
  StaleResourceBase *pSVar1;
  char (*in_RCX) [19];
  string msg;
  string local_40;
  
  if (NumReferences < 1) {
    FormatString<char[26],char[19]>
              (&local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"NumReferences >= 1",in_RCX);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"Create",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/ResourceReleaseQueue.hpp"
               ,0x48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if (NumReferences == 1) {
    pSVar1 = (StaleResourceBase *)operator_new(0x20);
    pSVar1->_vptr_StaleResourceBase = (_func_int **)&PTR__SpecificStaleResource_00933298;
    pSVar1[1]._vptr_StaleResourceBase = (_func_int **)Resource->Page;
    pSVar1[2]._vptr_StaleResourceBase = (_func_int **)Resource->UnalignedOffset;
    pSVar1[3]._vptr_StaleResourceBase = (_func_int **)Resource->Size;
    Resource->Page = (VulkanMemoryPage *)0x0;
    Resource->UnalignedOffset = 0;
    Resource->Size = 0;
  }
  else {
    pSVar1 = (StaleResourceBase *)operator_new(0x28);
    pSVar1->_vptr_StaleResourceBase = (_func_int **)&PTR__SpecificSharedStaleResource_009332d8;
    pSVar1[1]._vptr_StaleResourceBase = (_func_int **)Resource->Page;
    pSVar1[2]._vptr_StaleResourceBase = (_func_int **)Resource->UnalignedOffset;
    pSVar1[3]._vptr_StaleResourceBase = (_func_int **)Resource->Size;
    Resource->Page = (VulkanMemoryPage *)0x0;
    Resource->UnalignedOffset = 0;
    Resource->Size = 0;
    pSVar1[4]._vptr_StaleResourceBase = (_func_int **)NumReferences;
  }
  this->m_pStaleResource = pSVar1;
  return (DynamicStaleResourceWrapper)(StaleResourceBase *)this;
}

Assistant:

static DynamicStaleResourceWrapper Create(ResourceType&& Resource, RefCounterType NumReferences)
    {
        VERIFY_EXPR(NumReferences >= 1);

        class SpecificStaleResource final : public StaleResourceBase
        {
        public:
            SpecificStaleResource(ResourceType&& SpecificResource) :
                m_SpecificResource(std::move(SpecificResource))
            {}

            // clang-format off
            SpecificStaleResource             (const SpecificStaleResource&) = delete;
            SpecificStaleResource             (SpecificStaleResource&&)      = delete;
            SpecificStaleResource& operator = (const SpecificStaleResource&) = delete;
            SpecificStaleResource& operator = (SpecificStaleResource&&)      = delete;
            // clang-format on

            virtual void Release() override final
            {
                delete this;
            }

        private:
            ResourceType m_SpecificResource;
        };

        class SpecificSharedStaleResource final : public StaleResourceBase
        {
        public:
            SpecificSharedStaleResource(ResourceType&& SpecificResource, RefCounterType NumReferences) :
                m_SpecificResource(std::move(SpecificResource)),
                m_RefCounter{NumReferences}
            {
            }

            // clang-format off
            SpecificSharedStaleResource             (const SpecificSharedStaleResource&) = delete;
            SpecificSharedStaleResource             (SpecificSharedStaleResource&&)      = delete;
            SpecificSharedStaleResource& operator = (const SpecificSharedStaleResource&) = delete;
            SpecificSharedStaleResource& operator = (SpecificSharedStaleResource&&)      = delete;
            // clang-format on

            virtual void Release() override final
            {
                if (m_RefCounter.fetch_add(-1) - 1 == 0)
                {
                    delete this;
                }
            }

        private:
            ResourceType                m_SpecificResource;
            std::atomic<RefCounterType> m_RefCounter;
        };

        return DynamicStaleResourceWrapper{
            NumReferences == 1 ?
                static_cast<StaleResourceBase*>(new SpecificStaleResource{std::move(Resource)}) :
                static_cast<StaleResourceBase*>(new SpecificSharedStaleResource{std::move(Resource), NumReferences})};
    }